

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

ktx_error_code_e printKTX2Info2(ktxStream *stream,KTX_header2 *pHeader)

{
  ktx_uint32_t kVar1;
  ktx_error_code_e kVar2;
  uint uVar3;
  ktxLevelIndexEntry *levelIndex;
  uint32_t *DFD;
  ktx_uint8_t *bgd;
  uint32_t level;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ktx_uint32_t kVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  
  if ((pHeader->dataFormatDescriptor).byteOffset == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = (pHeader->dataFormatDescriptor).byteLength != 0;
  }
  if ((pHeader->keyValueData).byteOffset == 0) {
    bVar10 = false;
  }
  else {
    bVar10 = (pHeader->keyValueData).byteLength != 0;
  }
  if ((pHeader->supercompressionGlobalData).byteOffset == 0) {
    bVar11 = false;
  }
  else {
    bVar11 = (pHeader->supercompressionGlobalData).byteLength != 0;
  }
  fwrite("Header\n\n",8,1,_stdout);
  printKTX2Header(pHeader);
  fwrite("\nLevel Index\n\n",0xe,1,_stdout);
  kVar8 = pHeader->levelCount + (uint)(pHeader->levelCount == 0);
  uVar7 = (ulong)(kVar8 * 0x18);
  levelIndex = (ktxLevelIndexEntry *)malloc(uVar7);
  if (levelIndex == (ktxLevelIndexEntry *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  kVar2 = (*stream->read)(stream,levelIndex,uVar7);
  if (kVar2 != KTX_SUCCESS) {
    free(levelIndex);
    return kVar2;
  }
  printLevelIndex(levelIndex,kVar8);
  free(levelIndex);
  if (bVar9) {
    fwrite("\nData Format Descriptor\n\n",0x19,1,_stdout);
    uVar7 = (ulong)(pHeader->dataFormatDescriptor).byteLength;
    DFD = (uint32_t *)malloc(uVar7);
    if (DFD == (uint32_t *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
    kVar2 = (*stream->read)(stream,DFD,uVar7);
    if (kVar2 != KTX_SUCCESS) goto LAB_001b98c7;
    if (*DFD != (pHeader->dataFormatDescriptor).byteLength) {
      free(DFD);
      return KTX_FILE_DATA_ERROR;
    }
    printDFD(DFD,*DFD);
    free(DFD);
  }
  if (bVar10) {
    fwrite("\nKey/Value Data\n\n",0x11,1,_stdout);
    uVar7 = (ulong)(pHeader->keyValueData).byteLength;
    DFD = (uint32_t *)malloc(uVar7);
    if (DFD == (uint32_t *)0x0) {
      return KTX_OUT_OF_MEMORY;
    }
    kVar2 = (*stream->read)(stream,DFD,uVar7);
    if (kVar2 != KTX_SUCCESS) {
LAB_001b98c7:
      free(DFD);
      return kVar2;
    }
    printKVData((ktx_uint8_t *)DFD,(pHeader->keyValueData).byteLength);
    free(DFD);
  }
  else {
    fwrite("\nNo Key/Value data.\n",0x14,1,_stdout);
  }
  if (bVar11) {
    if (pHeader->supercompressionScheme == 1) {
      bgd = (ktx_uint8_t *)malloc((pHeader->supercompressionGlobalData).byteLength);
      if (bgd == (ktx_uint8_t *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      kVar2 = (*stream->setpos)(stream,(pHeader->supercompressionGlobalData).byteOffset);
      if ((kVar2 != KTX_SUCCESS) ||
         (kVar2 = (*stream->read)(stream,bgd,(pHeader->supercompressionGlobalData).byteLength),
         kVar2 != KTX_SUCCESS)) {
        free(bgd);
        return kVar2;
      }
      kVar8 = pHeader->layerCount;
      uVar3 = pHeader->pixelDepth + (uint)(pHeader->pixelDepth == 0);
      kVar1 = pHeader->faceCount;
      uVar5 = uVar3;
      for (uVar4 = 1; uVar4 < pHeader->levelCount; uVar4 = uVar4 + 1) {
        uVar6 = uVar3 >> ((byte)uVar4 & 0x1f);
        uVar5 = uVar5 + uVar6 + (uint)(uVar6 == 0);
      }
      fwrite("\nBasis Supercompression Global Data\n\n",0x25,1,_stdout);
      printBasisSGDInfo(bgd,(pHeader->supercompressionGlobalData).byteLength,
                        (kVar8 + (kVar8 == 0)) * kVar1 * uVar5);
      free(bgd);
    }
    else {
      fwrite("\nUnrecognized supercompressionScheme.\n",0x26,1,_stdout);
    }
  }
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
printKTX2Info2(ktxStream* stream, KTX_header2* pHeader)
{
    const bool hasDFD =
            pHeader->dataFormatDescriptor.byteOffset != 0 &&
            pHeader->dataFormatDescriptor.byteLength != 0;
    const bool hasKVD =
            pHeader->keyValueData.byteOffset != 0 &&
            pHeader->keyValueData.byteLength != 0;
    const bool hasSGD =
            pHeader->supercompressionGlobalData.byteOffset != 0 &&
            pHeader->supercompressionGlobalData.byteLength != 0;

    ktx_uint32_t numLevels;
    ktxLevelIndexEntry* levelIndex;
    ktx_uint32_t levelIndexSize;
    KTX_error_code ec = KTX_SUCCESS;

    fprintf(stdout, "Header\n\n");
    printKTX2Header(pHeader);

    fprintf(stdout, "\nLevel Index\n\n");
    numLevels = MAX(1, pHeader->levelCount);
    levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    levelIndex = (ktxLevelIndexEntry*)malloc(levelIndexSize);
    if (levelIndex == NULL)
        return KTX_OUT_OF_MEMORY;
    ec = stream->read(stream, levelIndex, levelIndexSize);
    if (ec != KTX_SUCCESS) {
        free(levelIndex);
        return ec;
    }
    printLevelIndex(levelIndex, numLevels);
    free(levelIndex);

    if (hasDFD) {
        fprintf(stdout, "\nData Format Descriptor\n\n");
        ktx_uint32_t* dfd = (ktx_uint32_t*)malloc(pHeader->dataFormatDescriptor.byteLength);
        if (dfd == NULL)
            return KTX_OUT_OF_MEMORY;
        ec = stream->read(stream, dfd, pHeader->dataFormatDescriptor.byteLength);
        if (ec != KTX_SUCCESS) {
            free(dfd);
            return ec;
        }
        if (*dfd != pHeader->dataFormatDescriptor.byteLength) {
            free(dfd);
            return KTX_FILE_DATA_ERROR;
        }
        printDFD(dfd, pHeader->dataFormatDescriptor.byteLength);
        free(dfd);
    }

    if (hasKVD) {
        fprintf(stdout, "\nKey/Value Data\n\n");
        ktx_uint8_t* kvd = malloc(pHeader->keyValueData.byteLength);
        if (kvd == NULL)
            return KTX_OUT_OF_MEMORY;
        ec = stream->read(stream, kvd, pHeader->keyValueData.byteLength);
        if (ec != KTX_SUCCESS) {
            free(kvd);
            return ec;
        }
        printKVData(kvd, pHeader->keyValueData.byteLength);
        free(kvd);
    } else {
        fprintf(stdout, "\nNo Key/Value data.\n");
    }

    if (hasSGD) {
        if (pHeader->supercompressionScheme == KTX_SS_BASIS_LZ) {
            ktx_uint8_t* sgd = malloc(pHeader->supercompressionGlobalData.byteLength);
            if (sgd == NULL)
                return KTX_OUT_OF_MEMORY;
            ec = stream->setpos(stream, pHeader->supercompressionGlobalData.byteOffset);
            if (ec != KTX_SUCCESS) {
                free(sgd);
                return ec;
            }
            ec = stream->read(stream, sgd, pHeader->supercompressionGlobalData.byteLength);
            if (ec != KTX_SUCCESS) {
                free(sgd);
                return ec;
            }
            //
            // Calculate number of images
            //
            uint32_t layersFaces = MAX(pHeader->layerCount, 1) * pHeader->faceCount;
            uint32_t layerPixelDepth = MAX(pHeader->pixelDepth, 1);
            for(uint32_t level = 1; level < MAX(pHeader->levelCount, 1); level++)
                layerPixelDepth += MAX(MAX(pHeader->pixelDepth, 1) >> level, 1U);
            // NOTA BENE: faceCount * layerPixelDepth is only reasonable because
            // faceCount and depth can't both be > 1. I.e there are no 3d cubemaps.
            uint32_t numImages = layersFaces * layerPixelDepth;
            fprintf(stdout, "\nBasis Supercompression Global Data\n\n");
            printBasisSGDInfo(sgd, pHeader->supercompressionGlobalData.byteLength, numImages);
            free(sgd);
        } else {
            fprintf(stdout, "\nUnrecognized supercompressionScheme.\n");
        }
    }

    return ec;
}